

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node48.cpp
# Opt level: O2

void duckdb::Node48::DeleteChild(ART *art,Node *node,uint8_t byte)

{
  byte bVar1;
  Node48 *pNVar2;
  undefined7 in_register_00000011;
  ulong uVar3;
  Node node48;
  
  pNVar2 = Node::Ref<duckdb::Node48>(art,(Node)(node->super_IndexPointer).data,NODE_48);
  uVar3 = CONCAT71(in_register_00000011,byte) & 0xffffffff;
  Node::Free(art,pNVar2->children + pNVar2->child_index[uVar3]);
  pNVar2->child_index[uVar3] = '0';
  bVar1 = pNVar2->count - 1;
  pNVar2->count = bVar1;
  if (bVar1 < 0xc) {
    node48 = (Node)(node->super_IndexPointer).data;
    Node16::ShrinkNode48(art,node,&node48);
  }
  return;
}

Assistant:

void Node48::DeleteChild(ART &art, Node &node, const uint8_t byte) {
	auto &n48 = Node::Ref<Node48>(art, node, NODE_48);

	// Free the child and decrease the count.
	Node::Free(art, n48.children[n48.child_index[byte]]);
	n48.child_index[byte] = EMPTY_MARKER;
	n48.count--;

	// Shrink to Node16.
	if (n48.count < SHRINK_THRESHOLD) {
		auto node48 = node;
		Node16::ShrinkNode48(art, node, node48);
	}
}